

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O2

Vector4D * __thiscall CMU462::Matrix4x4::operator*(Matrix4x4 *this,Vector4D *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector4D *in_RDI;
  
  dVar2 = x->x;
  dVar3 = x->y;
  dVar4 = x->z;
  dVar5 = this->entries[0].y;
  dVar6 = this->entries[1].y;
  dVar7 = this->entries[2].y;
  dVar8 = this->entries[3].y;
  dVar1 = x->w;
  in_RDI->x = this->entries[3].x * dVar1 +
              this->entries[2].x * dVar4 + this->entries[1].x * dVar3 + this->entries[0].x * dVar2;
  in_RDI->y = dVar8 * dVar1 + dVar7 * dVar4 + dVar6 * dVar3 + dVar5 * dVar2;
  dVar5 = this->entries[0].w;
  dVar6 = this->entries[1].w;
  dVar7 = this->entries[2].w;
  dVar8 = this->entries[3].w;
  in_RDI->z = this->entries[3].z * dVar1 +
              this->entries[2].z * dVar4 + this->entries[1].z * dVar3 + this->entries[0].z * dVar2;
  in_RDI->w = dVar8 * dVar1 + dVar7 * dVar4 + dVar6 * dVar3 + dVar5 * dVar2;
  return in_RDI;
}

Assistant:

Vector4D Matrix4x4::operator*( const Vector4D& x ) const {
    return x[0]*entries[0] + // Add up products for each matrix column.
           x[1]*entries[1] +
           x[2]*entries[2] +
           x[3]*entries[3];
  }